

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_env.cc
# Opt level: O2

bool Rule::IsReservedBinding(string *var)

{
  bool bVar1;
  
  bVar1 = std::operator==(var,"command");
  if (!bVar1) {
    bVar1 = std::operator==(var,"depfile");
    if (!bVar1) {
      bVar1 = std::operator==(var,"dyndep");
      if (!bVar1) {
        bVar1 = std::operator==(var,"description");
        if (!bVar1) {
          bVar1 = std::operator==(var,"deps");
          if (!bVar1) {
            bVar1 = std::operator==(var,"generator");
            if (!bVar1) {
              bVar1 = std::operator==(var,"pool");
              if (!bVar1) {
                bVar1 = std::operator==(var,"restat");
                if (!bVar1) {
                  bVar1 = std::operator==(var,"rspfile");
                  if (!bVar1) {
                    bVar1 = std::operator==(var,"rspfile_content");
                    if (!bVar1) {
                      bVar1 = std::operator==(var,"msvc_deps_prefix");
                      return bVar1;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool Rule::IsReservedBinding(const string& var) {
  return var == "command" ||
      var == "depfile" ||
      var == "dyndep" ||
      var == "description" ||
      var == "deps" ||
      var == "generator" ||
      var == "pool" ||
      var == "restat" ||
      var == "rspfile" ||
      var == "rspfile_content" ||
      var == "msvc_deps_prefix";
}